

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_1::initialize
               (Header *header,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
               V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
               Compression compression)

{
  bool bVar1;
  ArgExc *this;
  TypedAttribute<Imf_2_5::ChannelList> *in_RDI;
  float in_XMM0_Da;
  stringstream _iex_throw_s;
  Attribute *in_stack_000002b0;
  char *in_stack_000002b8;
  Header *in_stack_000002c0;
  float *in_stack_fffffffffffffce8;
  TypedAttribute<float> *in_stack_fffffffffffffcf0;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffcf8;
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *in_stack_fffffffffffffd00;
  stringstream local_200 [16];
  ostream local_1f0 [468];
  float local_1c;
  TypedAttribute<Imf_2_5::ChannelList> *local_8;
  
  local_1c = in_XMM0_Da;
  local_8 = in_RDI;
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::TypedAttribute
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *)0x1200c1);
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::TypedAttribute
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *)0x12010d);
  bVar1 = std::isnormal(local_1c);
  if ((bVar1) && (0.0 <= local_1c)) {
    TypedAttribute<float>::TypedAttribute(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x120256);
    TypedAttribute<Imath_2_5::Vec2<float>_>::TypedAttribute
              ((TypedAttribute<Imath_2_5::Vec2<float>_> *)in_stack_fffffffffffffd00,
               (Vec2<float> *)in_stack_fffffffffffffcf8);
    Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    TypedAttribute<Imath_2_5::Vec2<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_2_5::Vec2<float>_> *)0x1202a2);
    TypedAttribute<float>::TypedAttribute(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x1202ee);
    TypedAttribute<Imf_2_5::LineOrder>::TypedAttribute
              ((TypedAttribute<Imf_2_5::LineOrder> *)in_stack_fffffffffffffcf0,
               (LineOrder *)in_stack_fffffffffffffce8);
    Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    TypedAttribute<Imf_2_5::LineOrder>::~TypedAttribute
              ((TypedAttribute<Imf_2_5::LineOrder> *)0x12033a);
    TypedAttribute<Imf_2_5::Compression>::TypedAttribute
              ((TypedAttribute<Imf_2_5::Compression> *)in_stack_fffffffffffffcf0,
               (Compression *)in_stack_fffffffffffffce8);
    Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    TypedAttribute<Imf_2_5::Compression>::~TypedAttribute
              ((TypedAttribute<Imf_2_5::Compression> *)0x120386);
    TypedAttribute<Imf_2_5::ChannelList>::TypedAttribute(local_8);
    Header::insert(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
    TypedAttribute<Imf_2_5::ChannelList>::~TypedAttribute(local_8);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_200);
  std::operator<<(local_1f0,"Invalid pixel aspect ratio");
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,local_200);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
initialize (Header &header,
	    const Box2i &displayWindow,
	    const Box2i &dataWindow,
	    float pixelAspectRatio,
	    const V2f &screenWindowCenter,
	    float screenWindowWidth,
	    LineOrder lineOrder,
	    Compression compression)
{
    header.insert ("displayWindow", Box2iAttribute (displayWindow));
    header.insert ("dataWindow", Box2iAttribute (dataWindow));
    if ( !std::isnormal (pixelAspectRatio) || pixelAspectRatio < 0.f)
        THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel aspect ratio");
    header.insert ("pixelAspectRatio", FloatAttribute (pixelAspectRatio));
    header.insert ("screenWindowCenter", V2fAttribute (screenWindowCenter));
    header.insert ("screenWindowWidth", FloatAttribute (screenWindowWidth));
    header.insert ("lineOrder", LineOrderAttribute (lineOrder));
    header.insert ("compression", CompressionAttribute (compression));
    header.insert ("channels", ChannelListAttribute ());
}